

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_25095d::ForwardTemplateReference::hasRHSComponentSlow
          (ForwardTemplateReference *this,OutputStream *S)

{
  bool bVar1;
  
  if (this->Printing == false) {
    this->Printing = true;
    bVar1 = Node::hasRHSComponent(this->Ref,S);
    this->Printing = false;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool hasRHSComponentSlow(OutputStream &S) const override {
    if (Printing)
      return false;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    return Ref->hasRHSComponent(S);
  }